

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
* __thiscall
rangeless::fn::impl::
maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
::operator=(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
            *this,maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
                  *other)

{
  char *pcVar1;
  bool *pbVar2;
  
  if (this == other) {
    return this;
  }
  pbVar2 = &this->m_empty;
  if (other->m_empty == false) {
    if (this->m_empty == false) {
      *pbVar2 = true;
    }
    *(undefined1 *)((long)&this->field_0 + 4) = 1;
    pcVar1 = (char *)((long)&other->field_0 + 4);
    if (*(char *)((long)&other->field_0 + 4) == '\0') {
      (this->field_0).m_value.m_current.field_0 = (other->field_0).m_value.m_current.field_0;
      *(undefined1 *)((long)&this->field_0 + 4) = 0;
      if (*(char *)((long)&other->field_0 + 4) == '\0') {
        *pcVar1 = '\x01';
      }
    }
    *(undefined4 *)((long)&this->field_0 + 0xf) = *(undefined4 *)((long)&other->field_0 + 0xf);
    (this->field_0).m_value.m_gen.parent = (other->field_0).m_value.m_gen.parent;
    this->m_empty = false;
    if (other->m_empty != false) {
      return this;
    }
    pbVar2 = &other->m_empty;
    if (*pcVar1 != '\0') goto LAB_00170080;
  }
  else {
    if (this->m_empty != false) {
      return this;
    }
    if (*(char *)((long)&this->field_0 + 4) != '\0') goto LAB_00170080;
    pcVar1 = (char *)((long)&this->field_0 + 4);
  }
  *pcVar1 = '\x01';
LAB_00170080:
  *pbVar2 = true;
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }